

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.hpp
# Opt level: O1

int __thiscall diy::io::SharedOutFile::close(SharedOutFile *this,int __fd)

{
  undefined1 *comm;
  int iVar1;
  void *pvVar2;
  pointer pvVar3;
  long *plVar4;
  long *extraout_RAX;
  vector<char,_std::allocator<char>_> *cntnts;
  pointer pvVar5;
  vector<char,_std::allocator<char>_> contents;
  __string_type str;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  all_contents;
  ofstream fout;
  vector<char,_std::allocator<char>_> local_270;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  long local_250;
  long local_248 [2];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_238;
  undefined1 local_218 [248];
  ios_base local_120 [264];
  
  if (*(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
               field_0xa8 < 0) {
    local_270.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    iVar1 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x98;
    if (0 < iVar1) {
      MPI_Recv(&local_270,1,&ompi_mpi_int,iVar1 + -1,0,
               *(undefined8 *)
                &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 field_0x90,local_218);
    }
    std::ofstream::ofstream
              (local_218,
               (string *)
               &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                field_0x70,_S_app);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,local_258._M_current,local_250);
    if ((long *)local_258._M_current != local_248) {
      operator_delete(local_258._M_current,local_248[0] + 1);
    }
    iVar1 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x98;
    if (iVar1 < *(int *)&(this->super_ostringstream).
                         super_basic_ostream<char,_std::char_traits<char>_>.field_0x9c + -1) {
      MPI_Send(&local_270,1,&ompi_mpi_int,iVar1 + 1,0,
               *(undefined8 *)
                &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 field_0x90);
    }
    MPI_Barrier(*(undefined8 *)
                 &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x90);
    local_218._0_8_ = _VTT;
    *(undefined8 *)(local_218 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_218 + 8));
    plVar4 = (long *)std::ios_base::~ios_base(local_120);
  }
  else {
    std::__cxx11::stringbuf::str();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)&local_270,local_258,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_258._M_current + local_250),(allocator_type *)local_218);
    comm = &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
            field_0x90;
    iVar1 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0xa8;
    if (*(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 field_0x98 == iVar1) {
      local_238.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mpi::Collectives<char,_void_*>::gather((communicator *)comm,&local_270,&local_238,iVar1);
      std::ofstream::ofstream
                (local_218,
                 (string *)
                 &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70,_S_out);
      pvVar3 = local_238.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_238.
          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_238.
          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar5 = local_238.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::ostream::write(local_218,
                              (long)(pvVar5->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_start);
          pvVar5 = pvVar5 + 1;
        } while (pvVar5 != pvVar3);
      }
      local_218._0_8_ = _VTT;
      *(undefined8 *)(local_218 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)(local_218 + 8));
      std::ios_base::~ios_base(local_120);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
    }
    else {
      mpi::Collectives<char,_void_*>::gather((communicator *)comm,&local_270,iVar1);
    }
    pvVar2 = (void *)CONCAT44(local_270.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_270.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_270.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
    }
    plVar4 = local_248;
    if ((long *)local_258._M_current != plVar4) {
      operator_delete(local_258._M_current,local_248[0] + 1);
      plVar4 = extraout_RAX;
    }
  }
  return (int)plVar4;
}

Assistant:

void    close()
        {
            if (root_ >= 0)
            {
                auto str = this->str();
                std::vector<char> contents(str.begin(), str.end());
                if (world_.rank() == root_)
                {
                    std::vector<std::vector<char>> all_contents;
                    diy::mpi::gather(world_, contents, all_contents, root_);

                    // write the file serially
                    std::ofstream fout(filename_);
                    for (auto& cntnts : all_contents)
                        fout.write(cntnts.data(), cntnts.size());
                } else
                    diy::mpi::gather(world_, contents, root_);
            } else
            {
                int x = 0;
                if (world_.rank() > 0)
                    world_.recv(world_.rank() - 1, 0, x);

                std::ofstream fout(filename_, std::ios_base::app);
                fout << this->str();

                if (world_.rank() < world_.size() - 1)
                    world_.send(world_.rank() + 1, 0, x);

                world_.barrier();
            }
        }